

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void relation(int op,item *x,item *y)

{
  int iVar1;
  typeDesc *ptVar2;
  typeDesc *ptVar3;
  char *msg;
  
  ptVar2 = getType(x->typeIndex);
  ptVar3 = getType(y->typeIndex);
  iVar1 = x->typeIndex;
  if ((iVar1 == intTypeIndex) && (y->typeIndex == iVar1)) {
    if (ptVar2->form == 0x324) {
LAB_00107832:
      if ((op != 0x66) && (op != 0x69)) {
        msg = "bad relation of reference type";
LAB_001078d7:
        mark(msg);
        exit(-1);
      }
    }
    if ((y->mode == 0x2bd) && (y->a == 0)) {
      load(x);
      goto LAB_001078ab;
    }
  }
  else {
    if ((ptVar2->form == 0x324) && (ptVar3->form == 0x324)) goto LAB_00107832;
    if ((iVar1 == boolTypeIndex) && (y->typeIndex == iVar1)) {
      if ((op != 0x69) && (op != 0x66)) {
        msg = "bad relation for bool";
        goto LAB_001078d7;
      }
    }
    else if ((iVar1 != charTypeIndex) || (y->typeIndex != iVar1)) {
      msg = "bad type in relation";
      goto LAB_001078d7;
    }
  }
  putOp(5,x,y);
  regs[y->r] = 0;
LAB_001078ab:
  x->c = op;
  x->mode = 0x2c3;
  x->typeIndex = boolTypeIndex;
  x->a = 0;
  x->b = 0;
  return;
}

Assistant:

procedure
void relation(int op, struct item *x, struct item *y) {
	variable struct typeDesc *typeX; variable struct typeDesc *typeY;

	/* get types of both items */
	typeX = getType(x->typeIndex); typeY = getType(y->typeIndex);

	/* enter if both items are neither int nor ref */
	if (((x->typeIndex != intTypeIndex) || (y->typeIndex != intTypeIndex)) &&
		((typeX->form != FORM_REF) || (typeY->form != FORM_REF))) { 
		
		/* if items represent boolean stuff, ops are limited to == and != */
		if ((x->typeIndex == boolTypeIndex) && (y->typeIndex == boolTypeIndex)) { 
			if ((op == SYMBOL_EQUALTEST) || (op == SYMBOL_NOT)) {
				putOp(RISC_CMP,x,y);
				regs[y->r] = 0;
				x->c = op;
			} else {
				mark("bad relation for bool");
				exit(-1);
			}

		/* items might also represent chars */
		} elsif((x->typeIndex == charTypeIndex) && (y->typeIndex == charTypeIndex)) {
			putOp(RISC_CMP,x,y);
			regs[y->r] = 0;
			x->c = op;
		} else {
			mark("bad type in relation");
			exit(-1);
		}
	} else {
		if (typeX->form == FORM_REF) { /* check if reference */
			if ((op != SYMBOL_EQUALTEST) && (op != SYMBOL_NOT)) { /* only == or != allowed */
				mark("bad relation of reference type");
				exit(-1);
			}
		}
		if ((y->mode == CLASS_CONST) && (y->a == 0)) {
			load(x);
		} else {
			putOp(RISC_CMP,x,y);
			regs[y->r] = 0;
		}
		x->c = op;
	}
	x->mode = CLASS_COND;
	x->typeIndex = boolTypeIndex;
	x->a = 0; x->b = 0;
}